

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panning.cpp
# Opt level: O3

void aluInitRenderer(ALCdevice *device,int hrtf_id,HrtfRequestMode hrtf_appreq,
                    HrtfRequestMode hrtf_userreq)

{
  intrusive_ptr<HrtfStore> *this;
  RenderMode *pRVar1;
  float *pfVar2;
  float fVar3;
  DirectHrtfState *pDVar4;
  char *devName;
  pointer paVar5;
  BFormatDec *pBVar6;
  pointer pSVar7;
  pointer pbVar8;
  pointer pcVar9;
  HrtfStore *Hrtf;
  bs2b *ptr;
  Uhj2Encoder *ptr_00;
  DistanceComp *pDVar10;
  undefined1 auVar11 [8];
  undefined4 level;
  byte bVar12;
  int iVar13;
  uint uVar14;
  ALCenum AVar15;
  ulong uVar16;
  pointer pSVar17;
  anon_union_16_2_dde17770_for_FlexArray<float,_16UL>_3 *paVar18;
  long lVar19;
  code *pcVar20;
  bs2b *bs2b;
  Uhj2Encoder *__s;
  ulong uVar21;
  uint uVar22;
  pointer pSVar23;
  _Head_base<0UL,_FrontStablizer_*,_false> _Var24;
  ALCdevice *device_00;
  BFChannelConfig BVar25;
  undefined8 uVar26;
  char *pcVar27;
  char *mode_1;
  AmbDecConf *conf;
  ulong uVar28;
  pointer pbVar29;
  undefined1 *puVar30;
  size_t sVar31;
  ALuint AVar32;
  char *mode;
  undefined1 *puVar33;
  bool bVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  span<const_AngularPoint,_18446744073709551615UL> AmbiPoints;
  HrtfStorePtr old_hrtf;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> decopt;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> modeopt
  ;
  ALuint speakermap [16];
  float (*local_1a0) [16];
  LogLevel local_194;
  intrusive_ptr<HrtfStore> local_188;
  pointer local_180;
  ALCdevice *local_178;
  DistanceComp *local_170;
  undefined1 local_168 [8];
  BFormatDec **local_160;
  size_type sStack_158;
  BFormatDec *local_150;
  float afStack_148 [3];
  float local_13c;
  undefined1 local_138 [8];
  pointer pbStack_130;
  undefined1 auStack_128 [16];
  undefined8 uStack_118;
  Elevation *pEStack_110;
  HrirArray *local_108;
  vector<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_> vStack_100;
  float local_e8 [4];
  pointer local_d8;
  pointer paStack_d0;
  pointer local_c8;
  float afStack_c0 [4];
  pointer paStack_b0;
  pointer local_a8;
  pointer paStack_a0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  this = &device->mHrtf;
  local_188.mPtr = (device->mHrtf).mPtr;
  pDVar4 = (device->mHrtfState)._M_t.
           super___uniq_ptr_impl<DirectHrtfState,_std::default_delete<DirectHrtfState>_>._M_t.
           super__Tuple_impl<0UL,_DirectHrtfState_*,_std::default_delete<DirectHrtfState>_>.
           super__Head_base<0UL,_DirectHrtfState_*,_false>._M_head_impl;
  (device->mHrtfState)._M_t.
  super___uniq_ptr_impl<DirectHrtfState,_std::default_delete<DirectHrtfState>_>._M_t.
  super__Tuple_impl<0UL,_DirectHrtfState_*,_std::default_delete<DirectHrtfState>_>.
  super__Head_base<0UL,_DirectHrtfState_*,_false>._M_head_impl = (DirectHrtfState *)0x0;
  (device->mHrtf).mPtr = (HrtfStore *)0x0;
  local_178 = device;
  if (pDVar4 != (DirectHrtfState *)0x0) {
    al_free(pDVar4);
  }
  local_138 = (undefined1  [8])0x0;
  al::intrusive_ptr<HrtfStore>::operator=(this,(intrusive_ptr<HrtfStore> *)local_138);
  al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)local_138);
  device_00 = local_178;
  (local_178->HrtfName)._M_string_length = 0;
  *(local_178->HrtfName)._M_dataplus._M_p = '\0';
  local_178->mRenderMode = Normal;
  if (local_178->FmtChans == DevFmtChannelsDefault) {
    bVar12 = local_178->IsHeadphones;
    if (local_178->Type != Loopback) {
      ConfigValueStr_abi_cxx11_
                (&local_98,(local_178->DeviceName)._M_dataplus._M_p,(char *)0x0,"stereo-mode");
      auVar11 = local_138;
      local_138 = (undefined1  [8])((ulong)local_138 & 0xffffffffffffff00);
      pbStack_130 = (pointer)0x0;
      auStack_128._0_8_ = (pointer)0x0;
      auStack_128._8_8_ = 0;
      uStack_118 = (Field *)0x0;
      if (local_98.mHasValue == true) {
        uVar26 = local_98.field_1.mValue._M_dataplus._M_p;
        if (local_98.field_1.mValue._M_dataplus._M_p == (pointer)((long)&local_98.field_1 + 0x10)) {
          uStack_118 = (Field *)local_98.field_1._24_8_;
          uVar26 = (pointer)(auStack_128 + 8);
        }
        auStack_128._8_8_ = local_98.field_1._16_8_;
        auStack_128._0_8_ = local_98.field_1.mValue._M_string_length;
        local_138._1_7_ = auVar11._1_7_;
        local_138[0] = 1;
        pbStack_130 = (pointer)uVar26;
        iVar13 = al::strcasecmp((char *)uVar26,"headphones");
        if (iVar13 == 0) {
          bVar12 = 1;
        }
        else {
          iVar13 = al::strcasecmp((char *)uVar26,"speakers");
          if (iVar13 == 0) {
            bVar12 = 0;
          }
          else {
            iVar13 = al::strcasecmp((char *)uVar26,"auto");
            if ((iVar13 != 0) && (0 < (int)gLogLevel)) {
              fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected stereo-mode: %s\n",uVar26);
            }
          }
        }
      }
      if ((local_138[0] == '\x01') && (pbStack_130 != (pointer)(auStack_128 + 8))) {
        operator_delete(pbStack_130,auStack_128._8_8_ + 1);
      }
    }
    pRVar1 = &device_00->mRenderMode;
    if (hrtf_userreq == Hrtf_Enable) {
      device_00->HrtfStatus = 3;
LAB_001591c3:
      if ((device_00->HrtfList).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (device_00->HrtfList).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        EnumerateHrtf_abi_cxx11_
                  ((vector<std::string> *)&local_98,(device_00->DeviceName)._M_dataplus._M_p);
        auStack_128._0_8_ =
             (device_00->HrtfList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (device_00->HrtfList).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_98.field_1.mValue._M_string_length;
        local_138 = (undefined1  [8])
                    (device_00->HrtfList).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        pbStack_130 = (device_00->HrtfList).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        (device_00->HrtfList).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_98._0_8_;
        (device_00->HrtfList).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)local_98.field_1.mValue._M_dataplus._M_p;
        local_98._0_8_ = (pointer)0x0;
        local_98.field_1.mValue._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
        local_98.field_1.mValue._M_string_length = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                   *)local_138);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                   *)&local_98);
      }
      if ((-1 < hrtf_id) &&
         (pbVar29 = (device_00->HrtfList).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         (ulong)(uint)hrtf_id <
         (ulong)((long)(device_00->HrtfList).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar29 >> 5))) {
        GetLoadedHrtf((string *)local_138,(char *)(pbVar29 + (uint)hrtf_id),
                      (ALuint)(device_00->DeviceName)._M_dataplus._M_p);
        if (local_138 != (undefined1  [8])0x0) {
          al::intrusive_ptr<HrtfStore>::operator=(this,(intrusive_ptr<HrtfStore> *)local_138);
          std::__cxx11::string::_M_assign((string *)&device_00->HrtfName);
        }
        al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)local_138);
      }
      if (this->mPtr == (HrtfStore *)0x0) {
        pbVar29 = (device_00->HrtfList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 = (device_00->HrtfList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar29 != pbVar8) {
          pcVar9 = (local_178->DeviceName)._M_dataplus._M_p;
          do {
            GetLoadedHrtf((string *)local_138,(char *)pbVar29,(ALuint)pcVar9);
            if (local_138 != (undefined1  [8])0x0) {
              al::intrusive_ptr<HrtfStore>::operator=(this,(intrusive_ptr<HrtfStore> *)local_138);
              std::__cxx11::string::_M_assign((string *)&device_00->HrtfName);
              al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)local_138);
              break;
            }
            al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)local_138);
            pbVar29 = pbVar29 + 1;
          } while (pbVar29 != pbVar8);
        }
        device_00 = local_178;
        if (this->mPtr == (HrtfStore *)0x0) {
          AVar15 = 5;
LAB_00159662:
          device_00->HrtfStatus = AVar15;
          goto LAB_00159668;
        }
      }
      local_138 = (undefined1  [8])0x0;
      if (local_188.mPtr == (HrtfStore *)0x0) {
        local_188.mPtr = (HrtfStore *)0x0;
      }
      else {
        HrtfStore::release(local_188.mPtr);
        local_188.mPtr = (HrtfStore *)local_138;
      }
      local_138 = (undefined1  [8])0x0;
      al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)local_138);
      if ((anonymous_namespace)::InitHrtfPanning(ALCdevice*)::CornerElev == '\0') {
        aluInitRenderer();
      }
      if ((anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O == '\0') {
        aluInitRenderer();
      }
      if ((anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O == '\0') {
        aluInitRenderer();
      }
      device_00->mRenderMode = Hrtf;
      ConfigValueStr_abi_cxx11_
                (&local_98,(device_00->DeviceName)._M_dataplus._M_p,(char *)0x0,"hrtf-mode");
      auVar11 = local_138;
      local_138 = (undefined1  [8])((ulong)local_138 & 0xffffffffffffff00);
      pbStack_130 = (pointer)0x0;
      auStack_128._0_8_ = (pointer)0x0;
      auStack_128._8_8_ = 0;
      uStack_118 = (Field *)0x0;
      if (local_98.mHasValue == true) {
        uVar26 = local_98.field_1.mValue._M_dataplus._M_p;
        if (local_98.field_1.mValue._M_dataplus._M_p == (pointer)((long)&local_98.field_1 + 0x10)) {
          uStack_118 = (Field *)local_98.field_1._24_8_;
          uVar26 = (pointer)(auStack_128 + 8);
        }
        auStack_128._8_8_ = local_98.field_1._16_8_;
        auStack_128._0_8_ = local_98.field_1.mValue._M_string_length;
        local_138._1_7_ = auVar11._1_7_;
        local_138[0] = 1;
        pbStack_130 = (pointer)uVar26;
        iVar13 = al::strcasecmp((char *)uVar26,"basic");
        if ((iVar13 == 0) ||
           (iVar13 = al::strcasecmp((char *)uVar26,"ambi3"), pcVar27 = (char *)uVar26, iVar13 == 0))
        {
          if ((int)gLogLevel < 1) {
            pcVar27 = "ambi2";
          }
          else {
            pcVar27 = "ambi2";
            fprintf((FILE *)gLogFile,
                    "[ALSOFT] (EE) HRTF mode \"%s\" deprecated, substituting \"%s\"\n",uVar26,
                    "ambi2");
          }
        }
        puVar30 = (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::hrtf_modes;
        iVar13 = al::strcasecmp(pcVar27,(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::
                                        hrtf_modes);
        if (iVar13 != 0) {
          puVar30 = (undefined1 *)0x190fe0;
          iVar13 = al::strcasecmp(pcVar27,(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::
                                          hrtf_modes + 0x10);
          if (iVar13 != 0) {
            puVar30 = (undefined1 *)0x190ff0;
            iVar13 = al::strcasecmp(pcVar27,(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::
                                            hrtf_modes + 0x20);
            if (iVar13 != 0) {
              uVar22 = 1;
              if (0 < (int)gLogLevel) {
                fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected hrtf-mode: %s\n",pcVar27);
              }
              goto LAB_001594f2;
            }
          }
        }
        uVar22 = *(uint *)(puVar30 + 0xc);
        *pRVar1 = *(RenderMode *)(puVar30 + 8);
      }
      else {
        uVar22 = 1;
      }
LAB_001594f2:
      if ((local_138[0] == '\x01') && (pbStack_130 != (pointer)(auStack_128 + 8))) {
        operator_delete(pbStack_130,auStack_128._8_8_ + 1);
      }
      if (2 < (int)gLogLevel) {
        aluInitRenderer();
      }
      if (uVar22 < 2) {
        local_1a0 = (float (*) [16])(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiMatrix1O
        ;
        local_180 = (pointer)&(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O;
        puVar33 = (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O;
        puVar30 = (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiOrderHFGain1O;
      }
      else {
        local_1a0 = (float (*) [16])(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiMatrix2O
        ;
        local_180 = (pointer)&(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O;
        puVar33 = (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O;
        puVar30 = (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiOrderHFGain2O;
      }
      device_00->mAmbiOrder = uVar22;
      sVar31 = ((ulong)uVar22 + 1) * ((ulong)uVar22 + 1);
      AVar32 = uVar22;
      if (sVar31 != 0) {
        lVar19 = 0;
        do {
          (device_00->Dry).AmbiMap._M_elems[lVar19] =
               (BFChannelConfig)((ulong)AmbiIndex::FromACN._M_elems[lVar19] << 0x20 | 0x3f800000);
          lVar19 = lVar19 + 1;
        } while (sVar31 - lVar19 != 0);
        AVar32 = device_00->mAmbiOrder;
      }
      uVar14 = ChannelsFromDevFmt(device_00->FmtChans,AVar32);
      anon_unknown.dwarf_20794a::AllocChannels(device_00,sVar31,(ulong)uVar14);
      Hrtf = this->mPtr;
      DirectHrtfState::Create((DirectHrtfState *)local_138,sVar31);
      AmbiPoints.mDataEnd = local_180;
      AmbiPoints.mData = (pointer)puVar33;
      DirectHrtfState::build
                ((DirectHrtfState *)local_138,Hrtf,AmbiPoints,local_1a0,
                 (span<const_float,_4UL>)puVar30);
      auVar11 = local_138;
      local_138 = (undefined1  [8])0x0;
      pDVar4 = (device_00->mHrtfState)._M_t.
               super___uniq_ptr_impl<DirectHrtfState,_std::default_delete<DirectHrtfState>_>._M_t.
               super__Tuple_impl<0UL,_DirectHrtfState_*,_std::default_delete<DirectHrtfState>_>.
               super__Head_base<0UL,_DirectHrtfState_*,_false>._M_head_impl;
      (device_00->mHrtfState)._M_t.
      super___uniq_ptr_impl<DirectHrtfState,_std::default_delete<DirectHrtfState>_>._M_t.
      super__Tuple_impl<0UL,_DirectHrtfState_*,_std::default_delete<DirectHrtfState>_>.
      super__Head_base<0UL,_DirectHrtfState_*,_false>._M_head_impl = (DirectHrtfState *)auVar11;
      if (pDVar4 != (DirectHrtfState *)0x0) {
        al_free(pDVar4);
      }
      anon_unknown.dwarf_20794a::InitNearFieldCtrl(device_00,Hrtf->field->distance,uVar22,true);
      if (local_138 != (undefined1  [8])0x0) {
        al_free((void *)local_138);
      }
      pcVar20 = ALCdevice::ProcessHrtf;
    }
    else {
      if (hrtf_userreq == Hrtf_Default) {
        bVar12 = hrtf_appreq != Hrtf_Disable & bVar12;
        if ((hrtf_appreq == Hrtf_Enable) || (bVar12 != 0)) {
          device_00->HrtfStatus = (uint)bVar12 + (uint)bVar12 * 2 + 1;
          goto LAB_001591c3;
        }
      }
      else {
        AVar15 = 2;
        if (hrtf_appreq == Hrtf_Enable) goto LAB_00159662;
      }
LAB_00159668:
      local_138 = (undefined1  [8])0x0;
      if (local_188.mPtr == (HrtfStore *)0x0) {
        local_188.mPtr = (HrtfStore *)0x0;
      }
      else {
        HrtfStore::release(local_188.mPtr);
        local_188.mPtr = (HrtfStore *)local_138;
      }
      local_138 = (undefined1  [8])0x0;
      al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)local_138);
      device_00->mRenderMode = Pairwise;
      if (device_00->Type != Loopback) {
        pcVar27 = (device_00->DeviceName)._M_dataplus._M_p;
        ConfigValueInt(local_138,pcVar27,(char *)0x0);
        if ((local_138[0] != '\0') && (level = local_138._4_4_, local_138._4_4_ - 1 < 6)) {
          bs2b = (bs2b *)::bs2b::operator_new((bs2b *)0x2c,(size_t)pcVar27);
          bs2b->history[0].lo = 0.0;
          bs2b->history[0].hi = 0.0;
          bs2b->history[1].lo = 0.0;
          bs2b->history[1].hi = 0.0;
          bs2b->a0_hi = 0.0;
          bs2b->a1_hi = 0.0;
          bs2b->b1_hi = 0.0;
          bs2b->history[0].lo = 0.0;
          bs2b->level = 0;
          bs2b->srate = 0;
          bs2b->a0_lo = 0.0;
          bs2b->b1_lo = 0.0;
          ptr = (device_00->Bs2b)._M_t.super___uniq_ptr_impl<bs2b,_std::default_delete<bs2b>_>._M_t.
                super__Tuple_impl<0UL,_bs2b_*,_std::default_delete<bs2b>_>.
                super__Head_base<0UL,_bs2b_*,_false>._M_head_impl;
          (device_00->Bs2b)._M_t.super___uniq_ptr_impl<bs2b,_std::default_delete<bs2b>_>._M_t.
          super__Tuple_impl<0UL,_bs2b_*,_std::default_delete<bs2b>_>.
          super__Head_base<0UL,_bs2b_*,_false>._M_head_impl = bs2b;
          if (ptr != (bs2b *)0x0) {
            al_free(ptr);
            bs2b = (device_00->Bs2b)._M_t.super___uniq_ptr_impl<bs2b,_std::default_delete<bs2b>_>.
                   _M_t.super__Tuple_impl<0UL,_bs2b_*,_std::default_delete<bs2b>_>.
                   super__Head_base<0UL,_bs2b_*,_false>._M_head_impl;
          }
          bs2b_set_params(bs2b,level,device_00->Frequency);
          if (2 < (int)gLogLevel) {
            aluInitRenderer();
          }
          anon_unknown.dwarf_20794a::InitPanning(device_00,false,false);
          pcVar20 = ALCdevice::ProcessBs2b;
          goto LAB_00159935;
        }
      }
      pcVar27 = (device_00->DeviceName)._M_dataplus._M_p;
      ConfigValueStr_abi_cxx11_(&local_98,pcVar27,(char *)0x0,"stereo-encoding");
      auVar11 = local_138;
      local_138 = (undefined1  [8])((ulong)local_138 & 0xffffffffffffff00);
      pbStack_130 = (pointer)0x0;
      auStack_128._0_8_ = (pointer)0x0;
      auStack_128._8_8_ = 0;
      uStack_118 = (Field *)0x0;
      if (local_98.mHasValue == true) {
        uVar26 = local_98.field_1.mValue._M_dataplus._M_p;
        if (local_98.field_1.mValue._M_dataplus._M_p == (pointer)((long)&local_98.field_1 + 0x10)) {
          uStack_118 = (Field *)local_98.field_1._24_8_;
          uVar26 = (pointer)(auStack_128 + 8);
        }
        auStack_128._8_8_ = local_98.field_1._16_8_;
        auStack_128._0_8_ = local_98.field_1.mValue._M_string_length;
        local_138._1_7_ = auVar11._1_7_;
        local_138[0] = 1;
        pcVar27 = "uhj";
        pbStack_130 = (pointer)uVar26;
        iVar13 = al::strcasecmp((char *)uVar26,"uhj");
        if (iVar13 == 0) {
          *pRVar1 = Normal;
        }
        else {
          pcVar27 = "panpot";
          iVar13 = al::strcasecmp((char *)uVar26,"panpot");
          if ((iVar13 != 0) && (0 < (int)gLogLevel)) {
            pcVar27 = "[ALSOFT] (EE) Unexpected stereo-encoding: %s\n";
            fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected stereo-encoding: %s\n",uVar26);
          }
        }
      }
      if ((local_138[0] == '\x01') && (pbStack_130 != (pointer)(auStack_128 + 8))) {
        pcVar27 = (char *)(auStack_128._8_8_ + 1);
        operator_delete(pbStack_130,(ulong)pcVar27);
      }
      if (*pRVar1 == Normal) {
        __s = (Uhj2Encoder *)Uhj2Encoder::operator_new((Uhj2Encoder *)0x4000,(size_t)pcVar27);
        memset(__s,0,0x4000);
        ptr_00 = (device_00->Uhj_Encoder)._M_t.
                 super___uniq_ptr_impl<Uhj2Encoder,_std::default_delete<Uhj2Encoder>_>._M_t.
                 super__Tuple_impl<0UL,_Uhj2Encoder_*,_std::default_delete<Uhj2Encoder>_>.
                 super__Head_base<0UL,_Uhj2Encoder_*,_false>._M_head_impl;
        (device_00->Uhj_Encoder)._M_t.
        super___uniq_ptr_impl<Uhj2Encoder,_std::default_delete<Uhj2Encoder>_>._M_t.
        super__Tuple_impl<0UL,_Uhj2Encoder_*,_std::default_delete<Uhj2Encoder>_>.
        super__Head_base<0UL,_Uhj2Encoder_*,_false>._M_head_impl = __s;
        if (ptr_00 != (Uhj2Encoder *)0x0) {
          al_free(ptr_00);
        }
        if (2 < (int)gLogLevel) {
          aluInitRenderer();
        }
        device_00->mAmbiOrder = 1;
        lVar19 = 0;
        do {
          BVar25.Index._0_1_ = AmbiIndex::FromFuMa._M_elems[lVar19];
          BVar25.Scale = 1.0 / AmbiScale::FromFuMa._M_elems[AmbiIndex::FromFuMa._M_elems[lVar19]];
          BVar25.Index._1_3_ = 0;
          (device_00->Dry).AmbiMap._M_elems[lVar19] = BVar25;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 3);
        uVar14 = ChannelsFromDevFmt(device_00->FmtChans,device_00->mAmbiOrder);
        anon_unknown.dwarf_20794a::AllocChannels(device_00,3,(ulong)uVar14);
        pcVar20 = ALCdevice::ProcessUhj;
      }
      else {
        if (2 < (int)gLogLevel) {
          aluInitRenderer();
        }
        anon_unknown.dwarf_20794a::InitPanning(device_00,false,false);
        pcVar20 = ALCdevice::ProcessAmbiDec;
      }
    }
LAB_00159935:
    device_00->PostProcess = (PostProc)pcVar20;
    *(undefined8 *)&device_00->field_0x6e98 = 0;
    goto LAB_00159947;
  }
  local_138 = (undefined1  [8])0x0;
  if (local_188.mPtr == (HrtfStore *)0x0) {
    local_188.mPtr = (HrtfStore *)0x0;
  }
  else {
    HrtfStore::release(local_188.mPtr);
    local_188.mPtr = (HrtfStore *)local_138;
  }
  local_138 = (undefined1  [8])0x0;
  al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)local_138);
  if (hrtf_appreq == Hrtf_Enable) {
    device_00->HrtfStatus = 5;
  }
  bVar34 = true;
  pcVar27 = (char *)0x0;
  switch(device_00->FmtChans) {
  case DevFmtQuad:
    pcVar27 = "quad";
    break;
  case DevFmtX51:
  case DevFmtX51Rear:
    pcVar27 = "surround51";
    break;
  case DevFmtX61:
    pcVar27 = "surround61";
    break;
  case DevFmtX71:
    pcVar27 = "surround71";
    break;
  default:
    goto switchD_001587ce_caseD_6;
  }
  bVar34 = false;
switchD_001587ce_caseD_6:
  devName = (device_00->DeviceName)._M_dataplus._M_p;
  local_138 = (undefined1  [8])auStack_128;
  pbStack_130 = (pointer)0x0;
  auStack_128._0_8_ = auStack_128._0_8_ & 0xffffffffffffff00;
  uStack_118 = (Field *)0x0;
  pEStack_110 = (Elevation *)0x0;
  local_108 = (HrirArray *)0x0;
  vStack_100.
  super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_100.
  super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_100.
  super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e8[2] = 0.0;
  local_e8[3] = 0.0;
  local_d8 = (pointer)0x0;
  paStack_d0 = (pointer)0x0;
  local_c8 = (pointer)0x0;
  afStack_c0[0] = 0.0;
  afStack_c0[1] = 0.0;
  afStack_c0[2] = 0.0;
  afStack_c0[3] = 0.0;
  paStack_b0 = (pointer)0x0;
  local_a8 = (pointer)0x0;
  paStack_a0 = (pointer)0x0;
  if (bVar34) {
    conf = (AmbDecConf *)0x0;
  }
  else {
    ConfigValueStr_abi_cxx11_(&local_58,devName,"decoder",pcVar27);
    auVar11 = local_168;
    local_168 = (undefined1  [8])((ulong)local_168 & 0xffffffffffffff00);
    local_160 = (BFormatDec **)0x0;
    sStack_158 = 0;
    local_150 = (BFormatDec *)0x0;
    afStack_148[0] = 0.0;
    afStack_148[1] = 0.0;
    if (local_58.mHasValue == true) {
      if (local_58.field_1.mValue._M_dataplus._M_p == (_Alloc_hider)((long)&local_58 + 0x18U)) {
        afStack_148[0] = (float)local_58.field_1._24_4_;
        afStack_148[1] = (float)local_58.field_1._28_4_;
        local_58.field_1.mValue._M_dataplus._M_p = (_Alloc_hider)&local_150;
      }
      local_150 = (BFormatDec *)local_58.field_1._16_8_;
      sStack_158 = local_58.field_1.mValue._M_string_length;
      local_168._1_7_ = auVar11._1_7_;
      local_168[0] = (default_delete<BFormatDec>)0x1;
      local_160 = (BFormatDec **)local_58.field_1.mValue._M_dataplus._M_p;
      iVar13 = AmbDecConf::load((AmbDecConf *)local_138,
                                (char *)local_58.field_1.mValue._M_dataplus._M_p);
      if (iVar13 == 0) {
        if (0 < (int)gLogLevel) {
          aluInitRenderer();
        }
        goto LAB_001589fc;
      }
      if ((ulong)(((long)vStack_100.
                         super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)vStack_100.
                         super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333) <
          0x11) {
        if ((uint)uStack_118._4_4_ < 0x10000) {
          bVar34 = anon_unknown.dwarf_20794a::MakeSpeakerMap
                             (device_00,(AmbDecConf *)local_138,(ALuint (*) [16])&local_98);
          conf = (AmbDecConf *)0x0;
          if (bVar34) {
            conf = (AmbDecConf *)local_138;
          }
        }
        else {
          if ((int)gLogLevel < 1) goto LAB_001589fc;
          fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unsupported channel mask 0x%04x (max 0x%x)\n");
          conf = (AmbDecConf *)0x0;
        }
      }
      else {
        if ((int)gLogLevel < 1) goto LAB_001589fc;
        fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unsupported speaker count %zu (max %d)\n");
        conf = (AmbDecConf *)0x0;
      }
    }
    else {
LAB_001589fc:
      conf = (AmbDecConf *)0x0;
    }
    if ((local_168[0] == (default_delete<BFormatDec>)0x1) && (local_160 != &local_150)) {
      operator_delete(local_160,(ulong)((long)(local_150->mSamples)._M_elems[0]._M_elems + 1));
    }
  }
  if ((((device_00->RealOut).ChannelIndex._M_elems[2] == 0xffffffff) ||
      ((device_00->RealOut).ChannelIndex._M_elems[0] == 0xffffffff)) ||
     ((device_00->RealOut).ChannelIndex._M_elems[1] == 0xffffffff)) {
    bVar34 = false;
  }
  else {
    iVar13 = GetConfigValueBool(devName,(char *)0x0,"front-stablizer",0);
    bVar34 = iVar13 != 0;
  }
  iVar13 = GetConfigValueBool(devName,"decoder","hq-mode",1);
  if (conf == (AmbDecConf *)0x0) {
    anon_unknown.dwarf_20794a::InitPanning(device_00,iVar13 != 0,bVar34);
  }
  else {
    if (((iVar13 == 0) && (conf->FreqBands != 1)) && (0 < (int)gLogLevel)) {
      aluInitRenderer();
    }
    uVar22 = conf->ChanMask;
    AVar32 = 3;
    if (uVar22 < 0x200) {
      AVar32 = 2 - (uVar22 < 0x10);
    }
    device_00->mAmbiOrder = AVar32;
    if ((uVar22 & 0xfe7ce4) == 0) {
      sVar31 = (size_t)(AVar32 * 2 + 1);
      uVar28 = 0;
      do {
        (device_00->Dry).AmbiMap._M_elems[uVar28] =
             (BFChannelConfig)((ulong)AmbiIndex::From2D._M_elems[uVar28] << 0x20 | 0x3f800000);
        uVar28 = uVar28 + 1;
      } while (sVar31 != uVar28);
    }
    else {
      sVar31 = (ulong)(AVar32 + 1) * (ulong)(AVar32 + 1);
      lVar19 = 0;
      do {
        (device_00->Dry).AmbiMap._M_elems[lVar19] =
             (BFChannelConfig)((ulong)AmbiIndex::FromACN._M_elems[lVar19] << 0x20 | 0x3f800000);
        lVar19 = lVar19 + 1;
      } while (sVar31 - lVar19 != 0);
    }
    uVar14 = ChannelsFromDevFmt(device_00->FmtChans,device_00->mAmbiOrder);
    anon_unknown.dwarf_20794a::AllocChannels(device_00,sVar31,(ulong)uVar14);
    if (bVar34 == false) {
LAB_00158cac:
      _Var24._M_head_impl = (FrontStablizer *)0x0;
LAB_00158cae:
      local_58._0_8_ = _Var24._M_head_impl;
      if (2 < (int)gLogLevel) {
        aluInitRenderer();
      }
    }
    else {
      lVar19 = (long)(conf->Speakers).
                     super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(conf->Speakers).
                     super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if (lVar19 == 0) {
        uVar28 = 0;
      }
      else {
        lVar19 = (lVar19 >> 4) * -0x3333333333333333;
        uVar21 = lVar19 + (ulong)(lVar19 == 0);
        uVar16 = 0;
        do {
          uVar28 = uVar16;
          if (*(int *)(&local_98.mHasValue + uVar16 * 4) == 2) break;
          uVar16 = uVar16 + 1;
          uVar28 = uVar21;
        } while (uVar21 != uVar16);
      }
      paVar5 = (conf->LFMatrix).
               super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar28 < (ulong)((long)(conf->LFMatrix).
                                 super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 6)) {
        lVar19 = 0;
        auVar37 = (undefined1  [16])0x0;
        do {
          pfVar2 = paVar5[uVar28]._M_elems + lVar19;
          auVar39._4_4_ = -(uint)(pfVar2[1] != 0.0);
          auVar39._0_4_ = -(uint)(*pfVar2 != 0.0);
          auVar39._8_4_ = -(uint)(pfVar2[2] != 0.0);
          auVar39._12_4_ = -(uint)(pfVar2[3] != 0.0);
          auVar39 = packssdw(auVar39,auVar39);
          auVar39 = packsswb(auVar39,auVar39);
          auVar37 = auVar37 | auVar39 & _DAT_00190170;
          lVar19 = lVar19 + 4;
        } while (lVar19 != 0x10);
        auVar36._0_4_ = auVar37._0_4_ >> 0x10;
        auVar36._4_4_ = 0;
        auVar36._8_4_ = auVar37._8_4_ >> 0x10;
        auVar36._12_4_ = auVar37._12_4_ >> 0x10;
        auVar36 = auVar36 | auVar37;
        auVar37._0_2_ = auVar36._0_2_ >> 8;
        auVar37._2_6_ = 0;
        auVar37._8_2_ = auVar36._8_2_ >> 8;
        auVar37._10_2_ = auVar36._10_2_ >> 8;
        auVar37._12_2_ = auVar36._12_2_ >> 8;
        auVar37._14_2_ = auVar36._14_2_ >> 8;
        uVar22 = SUB164(auVar37 | auVar36,0);
        if (((auVar37 | auVar36) & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_00158c2c;
      }
      else {
        uVar22 = 0;
LAB_00158c2c:
        paVar5 = (conf->HFMatrix).
                 super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (uVar28 < (ulong)((long)(conf->HFMatrix).
                                   super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 6))
        {
          auVar37 = ZEXT416(uVar22 & 0xff);
          lVar19 = 0;
          do {
            pfVar2 = paVar5[uVar28]._M_elems + lVar19;
            auVar40._4_4_ = -(uint)(pfVar2[1] != 0.0);
            auVar40._0_4_ = -(uint)(*pfVar2 != 0.0);
            auVar40._8_4_ = -(uint)(pfVar2[2] != 0.0);
            auVar40._12_4_ = -(uint)(pfVar2[3] != 0.0);
            auVar39 = packssdw(auVar40,auVar40);
            auVar39 = packsswb(auVar39,auVar39);
            auVar37 = auVar37 | auVar39 & _DAT_00190170;
            lVar19 = lVar19 + 4;
          } while (lVar19 != 0x10);
          auVar38._0_4_ = auVar37._0_4_ >> 0x10;
          auVar38._4_4_ = 0;
          auVar38._8_4_ = auVar37._8_4_ >> 0x10;
          auVar38._12_4_ = auVar37._12_4_ >> 0x10;
          uVar22 = (uint)(ushort)(SUB162(auVar38 | auVar37,0) >> 8) | SUB164(auVar38 | auVar37,0);
        }
      }
      if ((uVar22 & 1) != 0) goto LAB_00158cac;
      uVar14 = ChannelsFromDevFmt(device_00->FmtChans,device_00->mAmbiOrder);
      anon_unknown.dwarf_20794a::CreateStablizer((size_t)local_168,uVar14);
      _Var24._M_head_impl = (FrontStablizer *)local_168;
      local_58._0_8_ = local_168;
      if (2 < (int)gLogLevel) {
        aluInitRenderer();
        goto LAB_00158cae;
      }
    }
    device_00 = local_178;
    BFormatDec::Create((BFormatDec *)local_168,conf,iVar13 != 0,sVar31,local_178->Frequency,
                       (ALuint (*) [16])&local_98,
                       (unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)&local_58
                      );
    auVar11 = local_168;
    local_168 = (undefined1  [8])0x0;
    pBVar6 = (device_00->AmbiDecoder)._M_t.
             super___uniq_ptr_impl<BFormatDec,_std::default_delete<BFormatDec>_>._M_t.
             super__Tuple_impl<0UL,_BFormatDec_*,_std::default_delete<BFormatDec>_>.
             super__Head_base<0UL,_BFormatDec_*,_false>._M_head_impl;
    (device_00->AmbiDecoder)._M_t.
    super___uniq_ptr_impl<BFormatDec,_std::default_delete<BFormatDec>_>._M_t.
    super__Tuple_impl<0UL,_BFormatDec_*,_std::default_delete<BFormatDec>_>.
    super__Head_base<0UL,_BFormatDec_*,_false>._M_head_impl = (BFormatDec *)auVar11;
    if ((pBVar6 != (BFormatDec *)0x0) &&
       (std::default_delete<BFormatDec>::operator()
                  ((default_delete<BFormatDec> *)&device_00->AmbiDecoder,pBVar6),
       local_168 != (undefined1  [8])0x0)) {
      std::default_delete<BFormatDec>::operator()
                ((default_delete<BFormatDec> *)local_168,(BFormatDec *)local_168);
    }
    local_168 = (undefined1  [8])0x0;
    if ((_Head_base<0UL,_FrontStablizer_*,_false>)local_58._0_8_ !=
        (_Head_base<0UL,_FrontStablizer_*,_false>)0x0) {
      al_free((void *)local_58._0_8_);
    }
    local_58._0_8_ = (_Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>)0x0;
    pSVar7 = (conf->Speakers).
             super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    fVar35 = 0.0;
    pSVar17 = (conf->Speakers).
              super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (pSVar23 = pSVar17; pSVar23 != pSVar7; pSVar23 = pSVar23 + 1) {
      fVar35 = fVar35 + pSVar23->Distance;
    }
    anon_unknown.dwarf_20794a::InitNearFieldCtrl
              (device_00,
               fVar35 / (float)(ulong)(((long)pSVar7 - (long)pSVar17 >> 4) * -0x3333333333333333),
               AVar32,(conf->ChanMask & 0xfe7ce4) != 0);
    fVar35 = 0.0;
    for (pSVar17 = (conf->Speakers).
                   super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pSVar17 !=
        (conf->Speakers).
        super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>.
        _M_impl.super__Vector_impl_data._M_finish; pSVar17 = pSVar17 + 1) {
      if (fVar35 <= pSVar17->Distance) {
        fVar35 = pSVar17->Distance;
      }
    }
    local_180 = (pointer)CONCAT44(local_180._4_4_,fVar35);
    iVar13 = GetConfigValueBool((device_00->DeviceName)._M_dataplus._M_p,"decoder","distance-comp",1
                               );
    if (((0.0 < local_180._0_4_) && (iVar13 != 0)) &&
       (pSVar17 = (conf->Speakers).
                  super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       (conf->Speakers).
       super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>.
       _M_impl.super__Vector_impl_data._M_finish != pSVar17)) {
      local_13c = (float)device_00->Frequency / 343.3;
      local_170 = &device_00->ChannelDelay;
      local_194 = gLogLevel;
      lVar19 = 8;
      sVar31 = 0;
      uVar28 = 0;
      fVar35 = local_180._0_4_;
      do {
        uVar16 = (ulong)*(uint *)(&local_98.mHasValue + uVar28 * 4);
        fVar3 = *(float *)((long)&(pSVar17->Name)._M_dataplus._M_p + lVar19 * 4);
        fVar35 = floorf((fVar35 - fVar3) * local_13c + 0.5);
        if (fVar35 <= 1023.0) {
LAB_00158f51:
          pDVar10 = local_170;
          uVar21 = (ulong)fVar35;
          (local_170->mChannels)._M_elems[uVar16].Length = (ALuint)uVar21;
          (local_170->mChannels)._M_elems[uVar16].Gain = fVar3 / local_180._0_4_;
          if (2 < (int)local_194) {
            fprintf((FILE *)gLogFile,
                    "[ALSOFT] (II) Channel %u \"%s\" distance compensation: %u samples, %f gain\n",
                    (double)(fVar3 / local_180._0_4_),uVar16,
                    *(undefined8 *)((long)pSVar17 + lVar19 * 4 + -0x20));
            uVar21 = (ulong)(pDVar10->mChannels)._M_elems[uVar16].Length;
            local_194 = gLogLevel;
          }
        }
        else {
          if (0 < (int)local_194) {
            fprintf((FILE *)gLogFile,
                    "[ALSOFT] (EE) Delay for speaker \"%s\" exceeds buffer length (%f > %d)\n",
                    (double)fVar35,*(undefined8 *)((long)pSVar17 + lVar19 * 4 + -0x20),0x3ff);
            fVar3 = *(float *)((long)&(pSVar17->Name)._M_dataplus._M_p + lVar19 * 4);
            local_194 = gLogLevel;
            fVar35 = 1023.0;
            goto LAB_00158f51;
          }
          (local_170->mChannels)._M_elems[uVar16].Length = 0x3ff;
          (local_170->mChannels)._M_elems[uVar16].Gain = fVar3 / local_180._0_4_;
          uVar21 = 0x3ff;
        }
        device_00 = local_178;
        sVar31 = sVar31 + ((uVar21 & 0xffffffff) + 3 & 0x1fffffffc);
        uVar28 = uVar28 + 1;
        pSVar17 = (conf->Speakers).
                  super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar19 = lVar19 + 0x14;
        fVar35 = local_180._0_4_;
      } while (uVar28 < (ulong)(((long)(conf->Speakers).
                                       super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar17 >>
                                4) * -0x3333333333333333));
      if (sVar31 != 0) {
        DistanceComp::setSampleCount(local_170,sVar31);
        uVar28._0_4_ = (device_00->ChannelDelay).mChannels._M_elems[0].Gain;
        uVar28._4_4_ = (device_00->ChannelDelay).mChannels._M_elems[0].Length;
        paVar18 = &((device_00->ChannelDelay).mSamples._M_t.
                    super___uniq_ptr_impl<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_al::FlexArray<float,_16UL>_*,_std::default_delete<al::FlexArray<float,_16UL>_>_>
                    .super__Head_base<0UL,_al::FlexArray<float,_16UL>_*,_false>._M_head_impl)->
                   field_1;
        (device_00->ChannelDelay).mChannels._M_elems[0].Buffer = (float *)paVar18;
        lVar19 = 0;
        do {
          uVar16 = uVar28 >> 0x20;
          uVar28 = *(ulong *)((long)&(device_00->ChannelDelay).mChannels._M_elems[1].Gain + lVar19);
          paVar18 = (anon_union_16_2_dde17770_for_FlexArray<float,_16UL>_3 *)
                    (paVar18->mArray + (uVar16 + 3 & 0x1fffffffc));
          *(anon_union_16_2_dde17770_for_FlexArray<float,_16UL>_3 **)
           ((long)&(device_00->ChannelDelay).mChannels._M_elems[1].Buffer + lVar19) = paVar18;
          lVar19 = lVar19 + 0x10;
        } while (lVar19 != 0xf0);
      }
    }
  }
  pBVar6 = (device_00->AmbiDecoder)._M_t.
           super___uniq_ptr_impl<BFormatDec,_std::default_delete<BFormatDec>_>._M_t.
           super__Tuple_impl<0UL,_BFormatDec_*,_std::default_delete<BFormatDec>_>.
           super__Head_base<0UL,_BFormatDec_*,_false>._M_head_impl;
  if (pBVar6 != (BFormatDec *)0x0) {
    if ((_Head_base<0UL,_FrontStablizer_*,_false>)
        *(_Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_> *)
         &(pBVar6->mStablizer)._M_t.
          super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_> ==
        (FrontStablizer *)0x0) {
      pcVar20 = ALCdevice::ProcessAmbiDec;
    }
    else {
      pcVar20 = ALCdevice::ProcessAmbiDecStablized;
    }
    device_00->PostProcess = (PostProc)pcVar20;
    *(undefined8 *)&device_00->field_0x6e98 = 0;
  }
  if (paStack_b0 != (pointer)0x0) {
    al_free(paStack_b0);
  }
  if (local_d8 != (pointer)0x0) {
    al_free(local_d8);
  }
  std::vector<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>::~vector
            (&vStack_100);
  if (local_138 != (undefined1  [8])auStack_128) {
    operator_delete((void *)local_138,(ulong)(auStack_128._0_8_ + 1));
  }
LAB_00159947:
  al::intrusive_ptr<HrtfStore>::~intrusive_ptr(&local_188);
  return;
}

Assistant:

void aluInitRenderer(ALCdevice *device, int hrtf_id, HrtfRequestMode hrtf_appreq,
    HrtfRequestMode hrtf_userreq)
{
    /* Hold the HRTF the device last used, in case it's used again. */
    HrtfStorePtr old_hrtf{std::move(device->mHrtf)};

    device->mHrtfState = nullptr;
    device->mHrtf = nullptr;
    device->HrtfName.clear();
    device->mRenderMode = RenderMode::Normal;

    if(device->FmtChans != DevFmtStereo)
    {
        old_hrtf = nullptr;
        if(hrtf_appreq == Hrtf_Enable)
            device->HrtfStatus = ALC_HRTF_UNSUPPORTED_FORMAT_SOFT;

        const char *layout{nullptr};
        switch(device->FmtChans)
        {
            case DevFmtQuad: layout = "quad"; break;
            case DevFmtX51: /* fall-through */
            case DevFmtX51Rear: layout = "surround51"; break;
            case DevFmtX61: layout = "surround61"; break;
            case DevFmtX71: layout = "surround71"; break;
            /* Mono, Stereo, and Ambisonics output don't use custom decoders. */
            case DevFmtMono:
            case DevFmtStereo:
            case DevFmtAmbi3D:
                break;
        }

        const char *devname{device->DeviceName.c_str()};
        ALuint speakermap[MAX_OUTPUT_CHANNELS];
        AmbDecConf *pconf{nullptr};
        AmbDecConf conf{};
        if(layout)
        {
            if(auto decopt = ConfigValueStr(devname, "decoder", layout))
            {
                if(!conf.load(decopt->c_str()))
                    ERR("Failed to load layout file %s\n", decopt->c_str());
                else if(conf.Speakers.size() > MAX_OUTPUT_CHANNELS)
                    ERR("Unsupported speaker count %zu (max %d)\n", conf.Speakers.size(),
                        MAX_OUTPUT_CHANNELS);
                else if(conf.ChanMask > AMBI_3ORDER_MASK)
                    ERR("Unsupported channel mask 0x%04x (max 0x%x)\n", conf.ChanMask,
                        AMBI_3ORDER_MASK);
                else if(MakeSpeakerMap(device, &conf, speakermap))
                    pconf = &conf;
            }
        }

        /* Enable the stablizer only for formats that have front-left, front-
         * right, and front-center outputs.
         */
        const bool stablize{device->RealOut.ChannelIndex[FrontCenter] != INVALID_CHANNEL_INDEX
            && device->RealOut.ChannelIndex[FrontLeft] != INVALID_CHANNEL_INDEX
            && device->RealOut.ChannelIndex[FrontRight] != INVALID_CHANNEL_INDEX
            && GetConfigValueBool(devname, nullptr, "front-stablizer", 0) != 0};
        const bool hqdec{GetConfigValueBool(devname, "decoder", "hq-mode", 1) != 0};
        if(!pconf)
            InitPanning(device, hqdec, stablize);
        else
            InitCustomPanning(device, hqdec, stablize, pconf, speakermap);
        if(auto *ambidec{device->AmbiDecoder.get()})
        {
            device->PostProcess = ambidec->hasStablizer() ? &ALCdevice::ProcessAmbiDecStablized
                : &ALCdevice::ProcessAmbiDec;
        }
        return;
    }

    bool headphones{device->IsHeadphones};
    if(device->Type != DeviceType::Loopback)
    {
        if(auto modeopt = ConfigValueStr(device->DeviceName.c_str(), nullptr, "stereo-mode"))
        {
            const char *mode{modeopt->c_str()};
            if(al::strcasecmp(mode, "headphones") == 0)
                headphones = true;
            else if(al::strcasecmp(mode, "speakers") == 0)
                headphones = false;
            else if(al::strcasecmp(mode, "auto") != 0)
                ERR("Unexpected stereo-mode: %s\n", mode);
        }
    }

    if(hrtf_userreq == Hrtf_Default)
    {
        bool usehrtf = (headphones && hrtf_appreq != Hrtf_Disable) ||
                       (hrtf_appreq == Hrtf_Enable);
        if(!usehrtf) goto no_hrtf;

        device->HrtfStatus = ALC_HRTF_ENABLED_SOFT;
        if(headphones && hrtf_appreq != Hrtf_Disable)
            device->HrtfStatus = ALC_HRTF_HEADPHONES_DETECTED_SOFT;
    }
    else
    {
        if(hrtf_userreq != Hrtf_Enable)
        {
            if(hrtf_appreq == Hrtf_Enable)
                device->HrtfStatus = ALC_HRTF_DENIED_SOFT;
            goto no_hrtf;
        }
        device->HrtfStatus = ALC_HRTF_REQUIRED_SOFT;
    }

    if(device->HrtfList.empty())
        device->HrtfList = EnumerateHrtf(device->DeviceName.c_str());

    if(hrtf_id >= 0 && static_cast<ALuint>(hrtf_id) < device->HrtfList.size())
    {
        const char *devname{device->DeviceName.c_str()};
        const std::string &hrtfname = device->HrtfList[static_cast<ALuint>(hrtf_id)];
        if(HrtfStorePtr hrtf{GetLoadedHrtf(hrtfname, devname, device->Frequency)})
        {
            device->mHrtf = std::move(hrtf);
            device->HrtfName = hrtfname;
        }
    }

    if(!device->mHrtf)
    {
        const char *devname{device->DeviceName.c_str()};
        for(const auto &hrtfname : device->HrtfList)
        {
            if(HrtfStorePtr hrtf{GetLoadedHrtf(hrtfname, devname, device->Frequency)})
            {
                device->mHrtf = std::move(hrtf);
                device->HrtfName = hrtfname;
                break;
            }
        }
    }

    if(device->mHrtf)
    {
        old_hrtf = nullptr;

        InitHrtfPanning(device);
        device->PostProcess = &ALCdevice::ProcessHrtf;
        return;
    }
    device->HrtfStatus = ALC_HRTF_UNSUPPORTED_FORMAT_SOFT;

no_hrtf:
    old_hrtf = nullptr;

    device->mRenderMode = RenderMode::Pairwise;

    if(device->Type != DeviceType::Loopback)
    {
        if(auto cflevopt = ConfigValueInt(device->DeviceName.c_str(), nullptr, "cf_level"))
        {
            if(*cflevopt > 0 && *cflevopt <= 6)
            {
                device->Bs2b = std::make_unique<bs2b>();
                bs2b_set_params(device->Bs2b.get(), *cflevopt,
                    static_cast<int>(device->Frequency));
                TRACE("BS2B enabled\n");
                InitPanning(device);
                device->PostProcess = &ALCdevice::ProcessBs2b;
                return;
            }
        }
    }

    if(auto encopt = ConfigValueStr(device->DeviceName.c_str(), nullptr, "stereo-encoding"))
    {
        const char *mode{encopt->c_str()};
        if(al::strcasecmp(mode, "uhj") == 0)
            device->mRenderMode = RenderMode::Normal;
        else if(al::strcasecmp(mode, "panpot") != 0)
            ERR("Unexpected stereo-encoding: %s\n", mode);
    }
    if(device->mRenderMode == RenderMode::Normal)
    {
        device->Uhj_Encoder = std::make_unique<Uhj2Encoder>();
        TRACE("UHJ enabled\n");
        InitUhjPanning(device);
        device->PostProcess = &ALCdevice::ProcessUhj;
        return;
    }

    TRACE("Stereo rendering\n");
    InitPanning(device);
    device->PostProcess = &ALCdevice::ProcessAmbiDec;
}